

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

void vector_gautbl_eval_logs3
               (vector_gautbl_t *gautbl,int32 offset,int32 count,float32 *x,int32 *score,
               logmath_t *logmath)

{
  uint uVar1;
  float32 **ppfVar2;
  float32 **ppfVar3;
  float32 *pfVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  float64 __x;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  uVar7 = (ulong)(uint)offset;
  __x = logmath_get_base(logmath);
  dVar8 = log((double)__x);
  dVar8 = 1.0 / dVar8;
  uVar1 = gautbl->veclen;
  iVar6 = offset + count + -1;
  if (offset < iVar6) {
    ppfVar2 = gautbl->mean;
    ppfVar3 = gautbl->var;
    pfVar4 = gautbl->lrd;
    dVar9 = (double)gautbl->distfloor;
    uVar7 = (ulong)offset;
    do {
      dVar11 = (double)(float)pfVar4[uVar7];
      dVar10 = (double)(float)pfVar4[uVar7 + 1];
      if (0 < (int)uVar1) {
        uVar5 = 0;
        do {
          dVar12 = (double)((float)x[uVar5] - (float)ppfVar2[uVar7][uVar5]);
          dVar11 = dVar11 - dVar12 * dVar12 * (double)(float)ppfVar3[uVar7][uVar5];
          dVar12 = (double)((float)x[uVar5] - (float)ppfVar2[uVar7 + 1][uVar5]);
          dVar10 = dVar10 - dVar12 * dVar12 * (double)(float)ppfVar3[uVar7 + 1][uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
      dVar12 = dVar9;
      if (dVar9 <= dVar11) {
        dVar12 = dVar11;
      }
      dVar11 = dVar9;
      if (dVar9 <= dVar10) {
        dVar11 = dVar10;
      }
      score[uVar7] = (int)(dVar12 * dVar8);
      score[uVar7 + 1] = (int)(dVar11 * dVar8);
      uVar7 = uVar7 + 2;
    } while ((long)uVar7 < (long)iVar6);
  }
  iVar6 = (int)uVar7;
  if (iVar6 < count + offset) {
    dVar9 = (double)(float)gautbl->lrd[iVar6];
    if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        dVar10 = (double)((float)x[uVar7] - (float)gautbl->mean[iVar6][uVar7]);
        dVar9 = dVar9 - dVar10 * dVar10 * (double)(float)gautbl->var[iVar6][uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
    dVar10 = (double)gautbl->distfloor;
    if ((double)gautbl->distfloor <= dVar9) {
      dVar10 = dVar9;
    }
    score[iVar6] = (int)(dVar8 * dVar10);
  }
  return;
}

Assistant:

void
vector_gautbl_eval_logs3(vector_gautbl_t * gautbl,
                         int32 offset,
                         int32 count, float32 * x, int32 * score, logmath_t * logmath)
{
    int32 i, r;
    float64 f;
    int32 end, veclen;
    float32 *m1, *m2, *v1, *v2;
    float64 dval1, dval2, diff1, diff2;

    f = 1.0 / log(logmath_get_base(logmath));

    /* Interleave evaluation of two vectors at a time for speed on pipelined machines */
    end = offset + count;
    veclen = gautbl->veclen;

    for (r = offset; r < end - 1; r += 2) {
        m1 = gautbl->mean[r];
        m2 = gautbl->mean[r + 1];
        v1 = gautbl->var[r];
        v2 = gautbl->var[r + 1];
        dval1 = gautbl->lrd[r];
        dval2 = gautbl->lrd[r + 1];

        for (i = 0; i < veclen; i++) {
            diff1 = x[i] - m1[i];
            dval1 -= diff1 * diff1 * v1[i];
            diff2 = x[i] - m2[i];
            dval2 -= diff2 * diff2 * v2[i];
        }

        if (dval1 < gautbl->distfloor)
            dval1 = gautbl->distfloor;
        if (dval2 < gautbl->distfloor)
            dval2 = gautbl->distfloor;

        score[r] = (int32) (f * dval1);
        score[r + 1] = (int32) (f * dval2);
    }

    if (r < end) {
        m1 = gautbl->mean[r];
        v1 = gautbl->var[r];
        dval1 = gautbl->lrd[r];

        for (i = 0; i < veclen; i++) {
            diff1 = x[i] - m1[i];
            dval1 -= diff1 * diff1 * v1[i];
        }

        if (dval1 < gautbl->distfloor)
            dval1 = gautbl->distfloor;

        score[r] = (int32) (f * dval1);
    }
}